

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O1

void __thiscall TApp_RecoverSubcommands_Test::TestBody(TApp_RecoverSubcommands_Test *this)

{
  bool bVar1;
  App *pAVar2;
  App *pAVar3;
  App *pAVar4;
  App *this_00;
  char *message;
  initializer_list<CLI::App_*> __l;
  AssertionResult gtest_ar;
  allocator_type local_199;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_198;
  internal local_180 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  App *local_170;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  App *local_160;
  App *local_158;
  App *local_150;
  string local_148;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"app1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  local_170 = CLI::App::add_subcommand(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"app2","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  pAVar2 = CLI::App::add_subcommand(this_00,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"app3","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  pAVar3 = CLI::App::add_subcommand(this_00,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"app4","");
  message = "";
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"","");
  pAVar4 = CLI::App::add_subcommand(this_00,&local_148,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  CLI::App::get_subcommands(&local_198,this_00,false);
  local_168.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_168;
  local_160 = pAVar2;
  local_158 = pAVar3;
  local_150 = pAVar4;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_128,__l,&local_199);
  testing::internal::
  CmpHelperEQ<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
            (local_180,"app.get_subcommands(false)",
             "std::vector<CLI::App *>({app1, app2, app3, app4})",&local_198,&local_128);
  if (local_128.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_178.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = ((local_178.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x4e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if ((App *)local_168.ptr_ != (App *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((App *)local_168.ptr_ != (App *)0x0)) {
        (**(code **)(*(long *)local_168.ptr_ + 8))();
      }
      local_168.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(TApp, RecoverSubcommands) {
    CLI::App *app1 = app.add_subcommand("app1");
    CLI::App *app2 = app.add_subcommand("app2");
    CLI::App *app3 = app.add_subcommand("app3");
    CLI::App *app4 = app.add_subcommand("app4");

    EXPECT_EQ(app.get_subcommands(false), std::vector<CLI::App *>({app1, app2, app3, app4}));
}